

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

bool nivalis::anon_unknown_10::is_var_name_reserved(string *var_name)

{
  bool bVar1;
  char *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar2;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
                          in_stack_ffffffffffffffe8);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    bVar2 = true;
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
      bVar2 = true;
      if (!bVar1) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
      }
    }
  }
  return bVar2;
}

Assistant:

bool is_var_name_reserved(const std::string& var_name) {
    return var_name == "x" || var_name == "y" ||
           var_name == "t" || var_name == "r";
}